

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O1

void __thiscall
glcts::ArraysOfArrays::InteractionFunctionCalls1<glcts::ArraysOfArrays::Interface::ES>::
execute_dispatch_test
          (InteractionFunctionCalls1<glcts::ArraysOfArrays::Interface::ES> *this,
          TestShaderType tested_shader_type,string *function_definition,string *function_use,
          string *verification)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  TestError *this_00;
  GLuint texture_object_id;
  GLuint vao_id;
  GLuint framebuffer_object_id;
  uchar buffer [4];
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  string local_40;
  long lVar3;
  
  prepare_compute_shader
            (&local_40,this,tested_shader_type,function_definition,function_use,verification);
  iVar1 = (*((this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).context_id)->
            m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.super_TestNode.
    _vptr_TestNode[10])
            (this,empty_string_abi_cxx11_,empty_string_abi_cxx11_,empty_string_abi_cxx11_,
             empty_string_abi_cxx11_,empty_string_abi_cxx11_,&local_40,0,0);
  local_44 = 0;
  local_48 = 0;
  local_50 = 0;
  local_4c = 0;
  (**(code **)(lVar3 + 0x1680))
            ((this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).program_object_id);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glUseProgram() failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                  ,0x11f1);
  (**(code **)(lVar3 + 0x6f8))(1,&local_50);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glGenTextures() failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                  ,0x11f4);
  (**(code **)(lVar3 + 0xb8))(0xde1,local_50);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glBindTexture() failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                  ,0x11f7);
  (**(code **)(lVar3 + 0x1380))(0xde1,1,0x8058,1,1);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glTexStorage2D() failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                  ,0x11fa);
  (**(code **)(lVar3 + 0x80))(0,local_50,0,0,0,0x88b9,0x8058);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glBindImageTexture() failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                  ,0x11fe);
  iVar1 = (**(code **)(lVar3 + 0xb48))
                    ((this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).
                     program_object_id,"uni_image");
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glGetUniformLocation() failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                  ,0x1201);
  if (iVar1 == -1) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Uniform is inactive",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x1205);
  }
  else {
    (**(code **)(lVar3 + 0x14f0))(iVar1,0);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"glUniform1i() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x1209);
    (**(code **)(lVar3 + 0x708))(1,&local_4c);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"glGenVertexArrays() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x120c);
    (**(code **)(lVar3 + 0xd8))(local_4c);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"glBindVertexArray() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x120f);
    (**(code **)(lVar3 + 0x528))(1,1,1);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"glDrawArrays() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x1212);
    (**(code **)(lVar3 + 0x6d0))(1,&local_48);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"glGenFramebuffers() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x1215);
    (**(code **)(lVar3 + 0x78))(0x8d40,local_48);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"glBindFramebuffer() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x1218);
    (**(code **)(lVar3 + 0x6a0))(0x8d40,0x8ce0,0xde1,local_50,0);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"glFramebufferTexture2D() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x121b);
    (**(code **)(lVar3 + 0x1a00))(0,0,1,1);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"glViewport() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x121e);
    (**(code **)(lVar3 + 0x1218))(0x8ce0);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"glReadBuffer() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x1221);
    (**(code **)(lVar3 + 0x1220))(0,0,1,1,0x1908,0x1401,&local_44);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"glReadPixels() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x1224);
    if ((char)local_44 == -1) {
      (**(code **)(lVar3 + 0x480))(1,&local_50);
      (**(code **)(lVar3 + 0x440))(1,&local_48);
      (**(code **)(lVar3 + 0x490))(1,&local_4c);
      dVar2 = (**(code **)(lVar3 + 0x800))();
      glu::checkError(dVar2,"An error ocurred while deleting generated objects.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                      ,0x122f);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
      return;
    }
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid array size was returned.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x1228);
  }
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void InteractionFunctionCalls1<API>::execute_dispatch_test(
	typename TestCaseBase<API>::TestShaderType tested_shader_type, const std::string& function_definition,
	const std::string& function_use, const std::string& verification)
{
	const std::string& compute_shader_source =
		prepare_compute_shader(tested_shader_type, function_definition, function_use, verification);
	const glw::Functions& gl = this->context_id.getRenderContext().getFunctions();

	this->execute_positive_test(empty_string, empty_string, empty_string, empty_string, empty_string,
								compute_shader_source, false, false);

	/* We are now ready to verify whether the returned size is correct. */
	unsigned char buffer[4]				= { 0 };
	glw::GLuint   framebuffer_object_id = 0;
	glw::GLint	location				= -1;
	glw::GLuint   texture_object_id		= 0;
	glw::GLuint   vao_id				= 0;

	gl.useProgram(this->program_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() failed.");

	gl.genTextures(1, &texture_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures() failed.");

	gl.bindTexture(GL_TEXTURE_2D, texture_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() failed.");

	gl.texStorage2D(GL_TEXTURE_2D, 1, GL_RGBA8, 1, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexStorage2D() failed.");

	gl.bindImageTexture(0 /* image unit */, texture_object_id, 0 /* level */, GL_FALSE /* layered */, 0 /* layer */,
						GL_WRITE_ONLY, GL_RGBA8);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindImageTexture() failed.");

	location = gl.getUniformLocation(this->program_object_id, "uni_image");
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetUniformLocation() failed.");

	if (-1 == location)
	{
		TCU_FAIL("Uniform is inactive");
	}

	gl.uniform1i(location, 0 /* image unit */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i() failed.");

	gl.genVertexArrays(1, &vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenVertexArrays() failed.");

	gl.bindVertexArray(vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray() failed.");

	gl.dispatchCompute(1, 1, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() failed.");

	gl.genFramebuffers(1, &framebuffer_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers() failed.");

	gl.bindFramebuffer(GL_FRAMEBUFFER, framebuffer_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer() failed.");

	gl.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, texture_object_id, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTexture2D() failed.");

	gl.viewport(0, 0, 1, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glViewport() failed.");

	gl.readBuffer(GL_COLOR_ATTACHMENT0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadBuffer() failed.");

	gl.readPixels(0, 0, 1, 1, GL_RGBA, GL_UNSIGNED_BYTE, buffer);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels() failed.");

	if (buffer[0] != 255)
	{
		TCU_FAIL("Invalid array size was returned.");
	}

	/* Delete generated objects. */
	gl.deleteTextures(1, &texture_object_id);
	gl.deleteFramebuffers(1, &framebuffer_object_id);
	gl.deleteVertexArrays(1, &vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "An error ocurred while deleting generated objects.");
}